

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QSettingsGroup>::moveAppend
          (QGenericArrayOps<QSettingsGroup> *this,QSettingsGroup *b,QSettingsGroup *e)

{
  QSettingsGroup *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QSettingsGroup *in_RDI;
  QSettingsGroup *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QSettingsGroup>::begin
                        ((QArrayDataPointer<QSettingsGroup> *)0x7c7877);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QSettingsGroup::QSettingsGroup(this_00,in_RDI);
      local_10 = local_10 + 0x28;
      (in_RDI->str).d.size = (in_RDI->str).d.size + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }